

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-feeder-c-impl.h
# Opt level: O0

void __thiscall
mp::NLW2_NLFeeder_C_Impl::
FeedVarBounds<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::VarBndWriter>
          (NLW2_NLFeeder_C_Impl *this,VarBndWriter *vbw)

{
  NLW2_NLFeeder_C *pNVar1;
  NLW2_NLFeeder_C_Impl *in_RDI;
  function<void_(double,_double)> vbwc;
  anon_class_8_1_ba1d82ab *__f;
  function<void_(double,_double)> *in_stack_ffffffffffffffb0;
  _func_void_void_ptr_void_ptr *p_Var2;
  anon_class_8_1_ba1d82ab local_30 [6];
  
  __f = local_30;
  std::function<void(double,double)>::
  function<mp::NLW2_NLFeeder_C_Impl::FeedVarBounds<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::VarBndWriter>(mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::VarBndWriter&)::_lambda(double,double)_1_,void>
            (in_stack_ffffffffffffffb0,__f);
  pNVar1 = NLF(in_RDI);
  p_Var2 = pNVar1->FeedVarBounds;
  pNVar1 = NLF(in_RDI);
  (*p_Var2)(pNVar1->p_user_data_,__f);
  std::function<void_(double,_double)>::~function((function<void_(double,_double)> *)0x115f01);
  return;
}

Assistant:

void FeedVarBounds(VarBoundsWriter& vbw) {
    assert(NLF().FeedVarBounds);
    std::function<void(double, double)> vbwc
        = [&vbw](double i, double v){
      vbw.WriteLbUb(i, v);
    };
    NLF().FeedVarBounds(NLF().p_user_data_, &vbwc);
  }